

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrtxml.cpp
# Opt level: O2

void write_tabs(FileStream *os)

{
  int iVar1;
  UnicodeString local_60;
  
  for (iVar1 = 0; iVar1 <= tabCount; iVar1 = iVar1 + 1) {
    icu_63::UnicodeString::UnicodeString(&local_60,"    ");
    write_utf8_file(os,&local_60);
    icu_63::UnicodeString::~UnicodeString(&local_60);
  }
  return;
}

Assistant:

static void write_tabs(FileStream* os){
    int i=0;
    for(;i<=tabCount;i++){
        write_utf8_file(os,UnicodeString("    "));
    }
}